

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixUnmapfile(unixFile *pFd)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x68) != 0) {
    (*aSyscall[0x17].pCurrent)(*(undefined8 *)(in_RDI + 0x68),*(undefined8 *)(in_RDI + 0x58));
    *(undefined8 *)(in_RDI + 0x68) = 0;
    *(undefined8 *)(in_RDI + 0x50) = 0;
    *(undefined8 *)(in_RDI + 0x58) = 0;
  }
  return;
}

Assistant:

static void unixUnmapfile(unixFile *pFd){
  assert( pFd->nFetchOut==0 );
  if( pFd->pMapRegion ){
    osMunmap(pFd->pMapRegion, pFd->mmapSizeActual);
    pFd->pMapRegion = 0;
    pFd->mmapSize = 0;
    pFd->mmapSizeActual = 0;
  }
}